

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifDsd.c
# Opt level: O0

void If_DsdManComputeTruthPtr(If_DsdMan_t *p,int iDsd,uchar *pPermLits,word *pRes)

{
  word **ppwVar1;
  word *pIn;
  word *pOut;
  int iVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  If_DsdObj_t *pIVar6;
  uint local_4c;
  int iPermLit;
  If_DsdObj_t *pObj;
  word *pwStack_28;
  int nSupp;
  word *pRes_local;
  uchar *pPermLits_local;
  If_DsdMan_t *pIStack_10;
  int iDsd_local;
  If_DsdMan_t *p_local;
  
  pObj._4_4_ = 0;
  pwStack_28 = pRes;
  pRes_local = (word *)pPermLits;
  pPermLits_local._4_4_ = iDsd;
  pIStack_10 = p;
  iVar2 = Abc_Lit2Var(iDsd);
  pIVar6 = If_DsdVecObj(&p->vObjs,iVar2);
  if (pPermLits_local._4_4_ == 0) {
    Abc_TtConst0(pwStack_28,pIStack_10->nWords);
  }
  else if (pPermLits_local._4_4_ == 1) {
    Abc_TtConst1(pwStack_28,pIStack_10->nWords);
  }
  else if ((*(uint *)&pIVar6->field_0x4 & 7) == 2) {
    if (pRes_local == (word *)0x0) {
      local_4c = Abc_Var2Lit(pObj._4_4_,0);
    }
    else {
      local_4c = (uint)*(byte *)((long)pRes_local + (long)pObj._4_4_);
    }
    pOut = pwStack_28;
    pObj._4_4_ = pObj._4_4_ + 1;
    ppwVar1 = pIStack_10->pTtElems;
    iVar2 = Abc_Lit2Var(local_4c);
    pIn = ppwVar1[iVar2];
    iVar2 = pIStack_10->nWords;
    uVar3 = Abc_LitIsCompl(pPermLits_local._4_4_);
    uVar4 = Abc_LitIsCompl(local_4c);
    Abc_TtCopy(pOut,pIn,iVar2,uVar3 ^ uVar4);
  }
  else {
    If_DsdManComputeTruth_rec
              (pIStack_10,pPermLits_local._4_4_,pwStack_28,(uchar *)pRes_local,
               (int *)((long)&pObj + 4));
  }
  iVar2 = pObj._4_4_;
  iVar5 = If_DsdVecLitSuppSize(&pIStack_10->vObjs,pPermLits_local._4_4_);
  if (iVar2 != iVar5) {
    __assert_fail("nSupp == If_DsdVecLitSuppSize(&p->vObjs, iDsd)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/map/if/ifDsd.c"
                  ,0x591,
                  "void If_DsdManComputeTruthPtr(If_DsdMan_t *, int, unsigned char *, word *)");
  }
  return;
}

Assistant:

void If_DsdManComputeTruthPtr( If_DsdMan_t * p, int iDsd, unsigned char * pPermLits, word * pRes )
{
    int nSupp = 0;
    If_DsdObj_t * pObj = If_DsdVecObj( &p->vObjs, Abc_Lit2Var(iDsd) );
    if ( iDsd == 0 )
        Abc_TtConst0( pRes, p->nWords );
    else if ( iDsd == 1 )
        Abc_TtConst1( pRes, p->nWords );
    else if ( pObj->Type == IF_DSD_VAR )
    {
        int iPermLit = pPermLits ? (int)pPermLits[nSupp] : Abc_Var2Lit(nSupp, 0);
        nSupp++;
        Abc_TtCopy( pRes, p->pTtElems[Abc_Lit2Var(iPermLit)], p->nWords, Abc_LitIsCompl(iDsd) ^ Abc_LitIsCompl(iPermLit) );
    }
    else
        If_DsdManComputeTruth_rec( p, iDsd, pRes, pPermLits, &nSupp );
    assert( nSupp == If_DsdVecLitSuppSize(&p->vObjs, iDsd) );
}